

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<13,_9,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  int i;
  undefined8 *puVar2;
  undefined8 *puVar3;
  long lVar4;
  undefined4 *puVar5;
  long lVar6;
  Matrix<float,_3,_3> *mat;
  long lVar7;
  undefined4 *puVar8;
  undefined4 uVar9;
  Type in0;
  Vector<float,_3> res_2;
  Vector<float,_3> res_3;
  Vector<float,_3> res_1;
  Vector<float,_3> res_4;
  Vector<float,_3> res;
  undefined8 local_a8;
  float fStack_a0;
  float afStack_9c [3];
  undefined8 uStack_90;
  float local_88;
  Vec4 *local_78;
  undefined8 local_70;
  undefined4 local_68;
  float local_60 [4];
  float local_50 [4];
  float local_40 [4];
  Matrix<float,_3,_3> local_30;
  
  puVar2 = &local_a8;
  puVar3 = &local_a8;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar4 = 0;
    lVar6 = 0;
    do {
      lVar7 = 0;
      do {
        uVar9 = 0x3f800000;
        if (lVar4 != lVar7) {
          uVar9 = 0;
        }
        *(undefined4 *)((long)puVar2 + lVar7) = uVar9;
        lVar7 = lVar7 + 0xc;
      } while (lVar7 != 0x24);
      lVar6 = lVar6 + 1;
      puVar2 = (undefined8 *)((long)puVar2 + 4);
      lVar4 = lVar4 + 0xc;
    } while (lVar6 != 3);
    local_a8 = *(undefined8 *)evalCtx->in[0].m_data;
    fStack_a0 = evalCtx->in[0].m_data[2];
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    afStack_9c[0] = (float)uVar1;
    afStack_9c[1] = (float)((ulong)uVar1 >> 0x20);
    afStack_9c[2] = evalCtx->in[1].m_data[2];
    uStack_90 = *(undefined8 *)evalCtx->in[2].m_data;
    local_88 = evalCtx->in[2].m_data[2];
    mat = (Matrix<float,_3,_3> *)0x3;
  }
  else {
    afStack_9c[1] = 0.0;
    afStack_9c[2] = 0.0;
    uStack_90 = 0;
    local_a8 = 0;
    fStack_a0 = 0.0;
    afStack_9c[0] = 0.0;
    local_88 = 0.0;
    puVar5 = &sr::(anonymous_namespace)::s_constInMat3x3;
    mat = (Matrix<float,_3,_3> *)0x0;
    do {
      lVar4 = 0;
      puVar8 = (undefined4 *)puVar3;
      do {
        *puVar8 = puVar5[lVar4];
        lVar4 = lVar4 + 1;
        puVar8 = puVar8 + 3;
      } while (lVar4 != 3);
      mat = (Matrix<float,_3,_3> *)((long)(mat->m_data).m_data[0].m_data + 1);
      puVar3 = (undefined8 *)((long)puVar3 + 4);
      puVar5 = puVar5 + 3;
    } while (mat != (Matrix<float,_3,_3> *)0x3);
  }
  local_30.m_data.m_data[0].m_data[2] = 0.0;
  local_30.m_data.m_data[0].m_data[0] = 0.0;
  local_30.m_data.m_data[0].m_data[1] = 0.0;
  lVar4 = 0;
  do {
    local_30.m_data.m_data[0].m_data[lVar4] =
         *(float *)((long)&local_a8 + lVar4 * 4) + afStack_9c[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_50[2] = 0.0;
  local_50[0] = 0.0;
  local_50[1] = 0.0;
  lVar4 = 0;
  do {
    local_50[lVar4] =
         local_30.m_data.m_data[0].m_data[lVar4] + *(float *)((long)&uStack_90 + lVar4 * 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  sr::(anonymous_namespace)::MatrixCaseUtils::increment<float,3,3>
            (&local_30,(MatrixCaseUtils *)&local_a8,mat);
  local_70 = (ulong)local_70._4_4_ << 0x20;
  local_78 = (Vec4 *)0x0;
  lVar4 = 0;
  do {
    *(float *)((long)&local_78 + lVar4 * 4) =
         local_30.m_data.m_data[0].m_data[lVar4] + local_30.m_data.m_data[1].m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_60[2] = 0.0;
  local_60[0] = 0.0;
  local_60[1] = 0.0;
  lVar4 = 0;
  do {
    local_60[lVar4] =
         *(float *)((long)&local_78 + lVar4 * 4) + local_30.m_data.m_data[2].m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_40[0] = 0.0;
  local_40[1] = 0.0;
  local_40[2] = 0.0;
  lVar4 = 0;
  do {
    local_50[lVar4 + 4] = local_50[lVar4] + local_60[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_78 = &evalCtx->color;
  local_70 = 0x100000000;
  local_68 = 2;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_78 + lVar4 * 4)] = local_50[lVar4 + 2];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(in0) + reduceToVec3(increment(in0));
	}